

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O1

char * rtosc_match_path(char *pattern,char *msg,char **path_end)

{
  byte *pbVar1;
  byte bVar2;
  ushort *puVar3;
  uint uVar4;
  uint uVar5;
  ushort **ppuVar6;
  byte *pbVar7;
  byte *__nptr;
  bool bVar8;
  byte *local_38;
  
  local_38 = (byte *)msg;
  if (path_end == (char **)0x0) {
    path_end = (char **)&local_38;
  }
LAB_001137fd:
  while (bVar2 = *pattern, bVar2 < 0x2f) {
    if (bVar2 == 0x23) {
      pbVar7 = (byte *)pattern + 1;
      ppuVar6 = __ctype_b_loc();
      __nptr = local_38;
      puVar3 = *ppuVar6;
      if (((*(byte *)((long)puVar3 + (long)(char)((byte *)pattern)[1] * 2 + 1) & 8) == 0) ||
         ((*(byte *)((long)puVar3 + (long)(char)*local_38 * 2 + 1) & 8) == 0)) {
        bVar8 = false;
      }
      else {
        uVar4 = atoi((char *)pbVar7);
        uVar5 = atoi((char *)__nptr);
        do {
          pbVar1 = pbVar7 + 1;
          pbVar7 = pbVar7 + 1;
        } while ((*(byte *)((long)puVar3 + (long)(char)*pbVar1 * 2 + 1) & 8) != 0);
        do {
          pbVar1 = __nptr + 1;
          __nptr = __nptr + 1;
        } while ((*(byte *)((long)puVar3 + (long)(char)*pbVar1 * 2 + 1) & 8) != 0);
        bVar8 = uVar5 < uVar4;
        local_38 = __nptr;
      }
      pattern = (char *)pbVar7;
      if (!bVar8) {
        return (char *)0x0;
      }
    }
    else {
      if (bVar2 != 0x2a) goto LAB_001138ef;
      for (; bVar2 = *pattern, bVar2 != 0; pattern = (char *)((byte *)pattern + 1)) {
        if ((bVar2 == 0x2f) || (bVar2 == 0x3a)) goto LAB_00113870;
      }
    }
  }
  if (bVar2 == 0x2f) {
    if (*local_38 == 0x2f) {
      local_38 = local_38 + 1;
      pbVar7 = (byte *)pattern + 1;
      pattern = (char *)((byte *)pattern + 1);
      if ((*pbVar7 == 0x3a) || (*pbVar7 == 0)) goto LAB_00113958;
      goto LAB_001137fd;
    }
  }
  else {
    if ((bVar2 == 0x3a) && (*local_38 == 0)) goto LAB_00113958;
    if (bVar2 == 0x7b) {
      pattern = rtosc_match_options(pattern,(char **)&local_38);
      if ((byte *)pattern == (byte *)0x0) {
        return (char *)0x0;
      }
      goto LAB_001137fd;
    }
  }
LAB_001138ef:
  if (bVar2 != *local_38) {
    return (char *)0x0;
  }
  if (*local_38 == 0) {
LAB_00113958:
    *path_end = (char *)local_38;
    return (char *)(byte *)pattern;
  }
  local_38 = local_38 + 1;
  pattern = (char *)((byte *)pattern + 1);
  goto LAB_001137fd;
LAB_00113870:
  for (; (*local_38 != 0 && (*local_38 != 0x2f)); local_38 = local_38 + 1) {
  }
  goto LAB_001137fd;
}

Assistant:

const char *rtosc_match_path(const char *pattern,
                             const char *msg, const char** path_end)
{
    if(!path_end)
        path_end = &msg; // writing *path_end = msg later will have no effect
    while(1) {
        //Check for special characters
        if(*pattern == ':' && !*msg)
            return *path_end = msg, pattern;
        else if(*pattern == '{') {
            pattern = rtosc_match_options(pattern, &msg);
            if(!pattern)
                return NULL;
        } else if(*pattern == '*') {
            //advance message and pattern to '/' or ':' and '\0'
            while(*pattern && *pattern != '/' && *pattern != ':')
                pattern++;
            if(*pattern == '/' || *pattern == ':')
                while(*msg && *msg != '/')
                    msg++;
        } else if(*pattern == '/' && *msg == '/') {
            ++pattern;
            ++msg;
            if(*pattern == '\0' || *pattern == ':')
                return *path_end = msg, pattern;
        } else if(*pattern == '#') {
            ++pattern;
            if(!rtosc_match_number(&pattern, &msg))
                return NULL;
        } else if((*pattern == *msg)) { //verbatim compare
            if(*msg)
                ++pattern, ++msg;
            else
                return *path_end = msg, pattern;
        } else
            return NULL;
    }
}